

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileSet.cxx
# Opt level: O0

bool cmFileSetVisibilityIsForSelf(cmFileSetVisibility vis)

{
  undefined1 local_9;
  cmFileSetVisibility vis_local;
  
  if (vis < Interface) {
    local_9 = true;
  }
  else if (vis == Interface) {
    local_9 = false;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool cmFileSetVisibilityIsForSelf(cmFileSetVisibility vis)
{
  switch (vis) {
    case cmFileSetVisibility::Interface:
      return false;
    case cmFileSetVisibility::Public:
    case cmFileSetVisibility::Private:
      return true;
  }
  return false;
}